

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitDestructuredArray
               (ParseNode *lhs,RegSlot rhsLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  undefined1 *puVar1;
  ByteCodeWriter *this;
  Type TVar2;
  ParseNode *list;
  ParseableFunctionInfo *pPVar3;
  code *pcVar4;
  bool bVar5;
  RegSlot iteratorReg;
  RegSlot value;
  uint cacheId;
  RegSlot R0;
  RegSlot R0_00;
  RegSlot R2;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  undefined4 *puVar6;
  ParseNodeArrLit *pPVar7;
  FuncInfo *pFVar8;
  RegSlot regSlot1;
  OpCode tryOp;
  RegSlot regSlot2;
  RegSlot local_34;
  
  ByteCodeGenerator::StartStatement(byteCodeGenerator,lhs);
  iteratorReg = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetIterator(iteratorReg,rhsLocation,byteCodeGenerator,funcInfo);
  if (lhs->nop != knopArrayPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ad6,"(lhs->nop == knopArrayPattern)","lhs->nop == knopArrayPattern");
    if (!bVar5) goto LAB_0081b5f0;
    *puVar6 = 0;
  }
  pPVar7 = ParseNode::AsParseNodeArrLit(lhs);
  list = (pPVar7->super_ParseNodeUni).pnode1;
  this = &byteCodeGenerator->m_writer;
  if (list == (ParseNode *)0x0) {
    EmitIteratorClose(iteratorReg,byteCodeGenerator,funcInfo,false);
  }
  else {
    value = FuncInfo::AcquireTmpRegister(funcInfo);
    cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,iteratorReg,0x107,true,false);
    Js::ByteCodeWriter::PatchableProperty(this,LdMethodFld,value,iteratorReg,cacheId,false,true);
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    R0_00 = FuncInfo::AcquireTmpRegister(funcInfo);
    Js::ByteCodeWriter::Reg1(this,LdFalse,R0);
    Js::ByteCodeWriter::Reg1(this,LdFalse,R0_00);
    ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
    ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
    pFVar8 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    puVar1 = &(pFVar8->byteCodeFunction->super_FunctionProxy).field_0x47;
    *puVar1 = *puVar1 | 8;
    pPVar3 = funcInfo->byteCodeFunction;
    if ((pPVar3->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_0081b5f0;
      *puVar6 = 0;
    }
    if ((ParseableFunctionInfo *)
        (((pPVar3->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar5) {
LAB_0081b5f0:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    TVar2 = ((pPVar3->super_FunctionProxy).functionInfo.ptr)->attributes;
    if ((TVar2 & (Async|Generator)) == None) {
      R2 = 0xffffffff;
      local_34 = 0xffffffff;
    }
    else {
      local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
      R2 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    labelID = Js::ByteCodeWriter::DefineLabel(this);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
    Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,true);
    if ((TVar2 & (Async|Generator)) == None) {
      Js::ByteCodeWriter::Br(this,TryFinally,labelID);
      tryOp = TryFinally;
      regSlot1 = 0xffffffff;
      regSlot2 = 0xffffffff;
    }
    else {
      Js::ByteCodeWriter::BrReg2(this,TryFinallyWithYield,labelID,local_34,R2);
      tryOp = TryFinallyWithYield;
      regSlot1 = local_34;
      regSlot2 = R2;
    }
    ByteCodeGenerator::PushJumpCleanupForTry(byteCodeGenerator,tryOp,labelID,regSlot1,regSlot2);
    Js::ByteCodeWriter::Br(this,TryCatch,labelID_00);
    ByteCodeGenerator::PushJumpCleanupForTry
              (byteCodeGenerator,TryCatch,labelID_00,0xffffffff,0xffffffff);
    EmitDestructuredArrayCore(list,iteratorReg,value,R0,R0_00,byteCodeGenerator,funcInfo);
    EmitIteratorCatchAndFinally
              (labelID_00,labelID,iteratorReg,R0,R0_00,local_34,R2,byteCodeGenerator,funcInfo,false)
    ;
    FuncInfo::ReleaseTmpRegister(funcInfo,value);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg);
  Js::ByteCodeWriter::EndStatement(this,lhs);
  return;
}

Assistant:

void EmitDestructuredArray(
    ParseNode *lhs,
    Js::RegSlot rhsLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    byteCodeGenerator->StartStatement(lhs);
    Js::RegSlot iteratorLocation = funcInfo->AcquireTmpRegister();

    EmitGetIterator(iteratorLocation, rhsLocation, byteCodeGenerator, funcInfo);

    Assert(lhs->nop == knopArrayPattern);
    ParseNode *list = lhs->AsParseNodeArrLit()->pnode1;

    if (list == nullptr)
    { // Handline this case ([] = obj);
        EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo);

        // No elements to bind or assign.
        funcInfo->ReleaseTmpRegister(iteratorLocation);
        byteCodeGenerator->EndStatement(lhs);
        return;
    }

    Js::RegSlot nextMethodReg = funcInfo->AcquireTmpRegister();
    EmitGetObjectMethod(
        nextMethodReg,
        iteratorLocation,
        Js::PropertyIds::next,
        byteCodeGenerator,
        funcInfo);

    // This variable facilitates on when to call the return function (which is Iterator close). When we are emitting bytecode for destructuring element
    // this variable will be set to true.
    Js::RegSlot shouldCallReturnFunctionLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot shouldCallReturnFunctionLocationFinally = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->SetHasFinally(true);
    byteCodeGenerator->SetHasTry(true);
    byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);

    Js::RegSlot regException = Js::Constants::NoRegister;
    Js::RegSlot regOffset = Js::Constants::NoRegister;
    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    if (isCoroutine)
    {
        regException = funcInfo->AcquireTmpRegister();
        regOffset = funcInfo->AcquireTmpRegister();
    }

    // Insert try node here
    Js::ByteCodeLabel finallyLabel = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    if (isCoroutine)
    {
        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::TryFinallyWithYield, finallyLabel, regException, regOffset);
        byteCodeGenerator->PushJumpCleanupForTry(
            Js::OpCode::TryFinallyWithYield,
            finallyLabel,
            regException,
            regOffset);
    }
    else
    {
        byteCodeGenerator->Writer()->Br(Js::OpCode::TryFinally, finallyLabel);
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryFinally, finallyLabel);
    }

    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);
    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    EmitDestructuredArrayCore(
        list,
        iteratorLocation,
        nextMethodReg,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        byteCodeGenerator,
        funcInfo);

    EmitIteratorCatchAndFinally(
        catchLabel,
        finallyLabel,
        iteratorLocation,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        regException,
        regOffset,
        byteCodeGenerator,
        funcInfo);

    funcInfo->ReleaseTmpRegister(nextMethodReg);
    funcInfo->ReleaseTmpRegister(iteratorLocation);

    byteCodeGenerator->EndStatement(lhs);
}